

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jmemmgr.c
# Opt level: O3

void realize_virt_arrays(j_common_ptr cinfo)

{
  uint uVar1;
  uint uVar2;
  jpeg_memory_mgr *pjVar3;
  ulong uVar4;
  size_t sVar5;
  JSAMPARRAY ppJVar6;
  JBLOCKARRAY ppaJVar7;
  JDIMENSION JVar8;
  _func_jvirt_sarray_ptr_j_common_ptr_int_boolean_JDIMENSION_JDIMENSION_JDIMENSION *p_Var9;
  _func_jvirt_barray_ptr_j_common_ptr_int_boolean_JDIMENSION_JDIMENSION_JDIMENSION *p_Var10;
  size_t min_bytes_needed;
  ulong max_bytes_needed;
  bool bVar11;
  
  pjVar3 = cinfo->mem;
  p_Var9 = pjVar3[1].request_virt_sarray;
  if (p_Var9 == (_func_jvirt_sarray_ptr_j_common_ptr_int_boolean_JDIMENSION_JDIMENSION_JDIMENSION *)
                0x0) {
    max_bytes_needed = 0;
    min_bytes_needed = 0;
  }
  else {
    min_bytes_needed = 0;
    max_bytes_needed = 0;
    do {
      if (*(long *)p_Var9 == 0) {
        uVar1 = *(uint *)(p_Var9 + 0xc);
        uVar4 = (ulong)*(uint *)(p_Var9 + 8) * (ulong)uVar1;
        uVar2 = *(uint *)(p_Var9 + 0x10);
        bVar11 = CARRY8(max_bytes_needed,uVar4);
        max_bytes_needed = max_bytes_needed + uVar4;
        if (bVar11) {
          *(undefined8 *)&cinfo->err->msg_code = 0xa00000036;
          (*cinfo->err->error_exit)(cinfo);
        }
        min_bytes_needed = min_bytes_needed + (ulong)uVar2 * (ulong)uVar1;
      }
      p_Var9 = *(_func_jvirt_sarray_ptr_j_common_ptr_int_boolean_JDIMENSION_JDIMENSION_JDIMENSION **
                )(p_Var9 + 0x30);
    } while (p_Var9 != (_func_jvirt_sarray_ptr_j_common_ptr_int_boolean_JDIMENSION_JDIMENSION_JDIMENSION
                        *)0x0);
  }
  for (p_Var10 = pjVar3[1].request_virt_barray;
      p_Var10 !=
      (_func_jvirt_barray_ptr_j_common_ptr_int_boolean_JDIMENSION_JDIMENSION_JDIMENSION *)0x0;
      p_Var10 = *(_func_jvirt_barray_ptr_j_common_ptr_int_boolean_JDIMENSION_JDIMENSION_JDIMENSION
                  **)(p_Var10 + 0x30)) {
    if (*(long *)p_Var10 == 0) {
      uVar1 = *(uint *)(p_Var10 + 0xc);
      uVar4 = (ulong)*(uint *)(p_Var10 + 8) * (ulong)uVar1 * 0x80;
      uVar2 = *(uint *)(p_Var10 + 0x10);
      bVar11 = CARRY8(max_bytes_needed,uVar4);
      max_bytes_needed = max_bytes_needed + uVar4;
      if (bVar11) {
        *(undefined8 *)&cinfo->err->msg_code = 0xb00000036;
        (*cinfo->err->error_exit)(cinfo);
      }
      min_bytes_needed = min_bytes_needed + (ulong)uVar1 * (ulong)uVar2 * 0x80;
    }
  }
  if (min_bytes_needed != 0) {
    sVar5 = jpeg_mem_available(cinfo,min_bytes_needed,max_bytes_needed,
                               (size_t)pjVar3[1].realize_virt_arrays);
    uVar4 = 1000000000;
    if (sVar5 < max_bytes_needed) {
      uVar4 = 1;
      if (min_bytes_needed <= sVar5) {
        uVar4 = sVar5 / min_bytes_needed;
      }
    }
    for (p_Var9 = pjVar3[1].request_virt_sarray;
        p_Var9 != (_func_jvirt_sarray_ptr_j_common_ptr_int_boolean_JDIMENSION_JDIMENSION_JDIMENSION
                   *)0x0;
        p_Var9 = *(_func_jvirt_sarray_ptr_j_common_ptr_int_boolean_JDIMENSION_JDIMENSION_JDIMENSION
                   **)(p_Var9 + 0x30)) {
      if (*(long *)p_Var9 == 0) {
        JVar8 = *(JDIMENSION *)(p_Var9 + 8);
        if (uVar4 < (long)((ulong)JVar8 - 1) / (long)(ulong)*(uint *)(p_Var9 + 0x10) + 1U) {
          *(uint *)(p_Var9 + 0x14) = *(uint *)(p_Var9 + 0x10) * (int)uVar4;
          jpeg_open_backing_store
                    (cinfo,(backing_store_ptr)(p_Var9 + 0x38),
                     (ulong)*(uint *)(p_Var9 + 0xc) * (ulong)JVar8);
          *(undefined4 *)(p_Var9 + 0x2c) = 1;
          JVar8 = *(JDIMENSION *)(p_Var9 + 0x14);
        }
        else {
          *(JDIMENSION *)(p_Var9 + 0x14) = JVar8;
        }
        ppJVar6 = alloc_sarray(cinfo,1,*(JDIMENSION *)(p_Var9 + 0xc),JVar8);
        *(JSAMPARRAY *)p_Var9 = ppJVar6;
        *(undefined4 *)(p_Var9 + 0x18) = *(undefined4 *)&pjVar3[1].access_virt_sarray;
        *(undefined8 *)(p_Var9 + 0x1c) = 0;
        *(undefined4 *)(p_Var9 + 0x28) = 0;
      }
    }
    for (p_Var10 = pjVar3[1].request_virt_barray;
        p_Var10 !=
        (_func_jvirt_barray_ptr_j_common_ptr_int_boolean_JDIMENSION_JDIMENSION_JDIMENSION *)0x0;
        p_Var10 = *(_func_jvirt_barray_ptr_j_common_ptr_int_boolean_JDIMENSION_JDIMENSION_JDIMENSION
                    **)(p_Var10 + 0x30)) {
      if (*(long *)p_Var10 == 0) {
        JVar8 = *(JDIMENSION *)(p_Var10 + 8);
        if (uVar4 < (long)((ulong)JVar8 - 1) / (long)(ulong)*(uint *)(p_Var10 + 0x10) + 1U) {
          *(uint *)(p_Var10 + 0x14) = *(uint *)(p_Var10 + 0x10) * (int)uVar4;
          jpeg_open_backing_store
                    (cinfo,(backing_store_ptr)(p_Var10 + 0x38),
                     (ulong)*(uint *)(p_Var10 + 0xc) * (ulong)JVar8 * 0x80);
          *(undefined4 *)(p_Var10 + 0x2c) = 1;
          JVar8 = *(JDIMENSION *)(p_Var10 + 0x14);
        }
        else {
          *(JDIMENSION *)(p_Var10 + 0x14) = JVar8;
        }
        ppaJVar7 = alloc_barray(cinfo,1,*(JDIMENSION *)(p_Var10 + 0xc),JVar8);
        *(JBLOCKARRAY *)p_Var10 = ppaJVar7;
        *(undefined4 *)(p_Var10 + 0x18) = *(undefined4 *)&pjVar3[1].access_virt_sarray;
        *(undefined8 *)(p_Var10 + 0x1c) = 0;
        *(undefined4 *)(p_Var10 + 0x28) = 0;
      }
    }
  }
  return;
}

Assistant:

METHODDEF(void)
realize_virt_arrays(j_common_ptr cinfo)
/* Allocate the in-memory buffers for any unrealized virtual arrays */
{
  my_mem_ptr mem = (my_mem_ptr)cinfo->mem;
  size_t space_per_minheight, maximum_space, avail_mem;
  size_t minheights, max_minheights;
  jvirt_sarray_ptr sptr;
  jvirt_barray_ptr bptr;

  /* Compute the minimum space needed (maxaccess rows in each buffer)
   * and the maximum space needed (full image height in each buffer).
   * These may be of use to the system-dependent jpeg_mem_available routine.
   */
  space_per_minheight = 0;
  maximum_space = 0;
  for (sptr = mem->virt_sarray_list; sptr != NULL; sptr = sptr->next) {
    if (sptr->mem_buffer == NULL) { /* if not realized yet */
      size_t new_space = (long)sptr->rows_in_array *
                         (long)sptr->samplesperrow * sizeof(JSAMPLE);

      space_per_minheight += (long)sptr->maxaccess *
                             (long)sptr->samplesperrow * sizeof(JSAMPLE);
      if (SIZE_MAX - maximum_space < new_space)
        out_of_memory(cinfo, 10);
      maximum_space += new_space;
    }
  }
  for (bptr = mem->virt_barray_list; bptr != NULL; bptr = bptr->next) {
    if (bptr->mem_buffer == NULL) { /* if not realized yet */
      size_t new_space = (long)bptr->rows_in_array *
                         (long)bptr->blocksperrow * sizeof(JBLOCK);

      space_per_minheight += (long)bptr->maxaccess *
                             (long)bptr->blocksperrow * sizeof(JBLOCK);
      if (SIZE_MAX - maximum_space < new_space)
        out_of_memory(cinfo, 11);
      maximum_space += new_space;
    }
  }

  if (space_per_minheight <= 0)
    return;                     /* no unrealized arrays, no work */

  /* Determine amount of memory to actually use; this is system-dependent. */
  avail_mem = jpeg_mem_available(cinfo, space_per_minheight, maximum_space,
                                 mem->total_space_allocated);

  /* If the maximum space needed is available, make all the buffers full
   * height; otherwise parcel it out with the same number of minheights
   * in each buffer.
   */
  if (avail_mem >= maximum_space)
    max_minheights = 1000000000L;
  else {
    max_minheights = avail_mem / space_per_minheight;
    /* If there doesn't seem to be enough space, try to get the minimum
     * anyway.  This allows a "stub" implementation of jpeg_mem_available().
     */
    if (max_minheights <= 0)
      max_minheights = 1;
  }

  /* Allocate the in-memory buffers and initialize backing store as needed. */

  for (sptr = mem->virt_sarray_list; sptr != NULL; sptr = sptr->next) {
    if (sptr->mem_buffer == NULL) { /* if not realized yet */
      minheights = ((long)sptr->rows_in_array - 1L) / sptr->maxaccess + 1L;
      if (minheights <= max_minheights) {
        /* This buffer fits in memory */
        sptr->rows_in_mem = sptr->rows_in_array;
      } else {
        /* It doesn't fit in memory, create backing store. */
        sptr->rows_in_mem = (JDIMENSION)(max_minheights * sptr->maxaccess);
        jpeg_open_backing_store(cinfo, &sptr->b_s_info,
                                (long)sptr->rows_in_array *
                                (long)sptr->samplesperrow *
                                (long)sizeof(JSAMPLE));
        sptr->b_s_open = TRUE;
      }
      sptr->mem_buffer = alloc_sarray(cinfo, JPOOL_IMAGE,
                                      sptr->samplesperrow, sptr->rows_in_mem);
      sptr->rowsperchunk = mem->last_rowsperchunk;
      sptr->cur_start_row = 0;
      sptr->first_undef_row = 0;
      sptr->dirty = FALSE;
    }
  }

  for (bptr = mem->virt_barray_list; bptr != NULL; bptr = bptr->next) {
    if (bptr->mem_buffer == NULL) { /* if not realized yet */
      minheights = ((long)bptr->rows_in_array - 1L) / bptr->maxaccess + 1L;
      if (minheights <= max_minheights) {
        /* This buffer fits in memory */
        bptr->rows_in_mem = bptr->rows_in_array;
      } else {
        /* It doesn't fit in memory, create backing store. */
        bptr->rows_in_mem = (JDIMENSION)(max_minheights * bptr->maxaccess);
        jpeg_open_backing_store(cinfo, &bptr->b_s_info,
                                (long)bptr->rows_in_array *
                                (long)bptr->blocksperrow *
                                (long)sizeof(JBLOCK));
        bptr->b_s_open = TRUE;
      }
      bptr->mem_buffer = alloc_barray(cinfo, JPOOL_IMAGE,
                                      bptr->blocksperrow, bptr->rows_in_mem);
      bptr->rowsperchunk = mem->last_rowsperchunk;
      bptr->cur_start_row = 0;
      bptr->first_undef_row = 0;
      bptr->dirty = FALSE;
    }
  }
}